

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void do_oldhelp(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  BUFFER *buffer;
  char *in_RSI;
  long in_RDI;
  int level;
  HELP_DATA *pHelp;
  BUFFER *output;
  char argone [4608];
  char argall [4608];
  bool found;
  undefined4 in_stack_ffffffffffffdbc8;
  int in_stack_ffffffffffffdbcc;
  int in_stack_ffffffffffffdbd0;
  int in_stack_ffffffffffffdbd4;
  CHAR_DATA *ch_00;
  BUFFER *in_stack_ffffffffffffdbe8;
  char local_1218 [4584];
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  char *local_10;
  
  bVar2 = false;
  local_10 = in_RSI;
  if (*in_RSI == '\0') {
    local_10 = "summary";
  }
  local_1218[0] = '\0';
  while (*local_10 != '\0') {
    local_10 = one_argument((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                            (char *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8));
    if (local_1218[0] != '\0') {
      strcat(local_1218," ");
    }
    strcat(local_1218,&stack0xffffffffffffdbe8);
  }
  buffer = new_buf();
  for (ch_00 = (CHAR_DATA *)help_first; ch_00 != (CHAR_DATA *)0x0; ch_00 = ch_00->next) {
    if (*(short *)&ch_00->next_in_room < 0) {
      in_stack_ffffffffffffdbcc = -1 - *(short *)&ch_00->next_in_room;
    }
    else {
      in_stack_ffffffffffffdbcc = (int)*(short *)&ch_00->next_in_room;
    }
    in_stack_ffffffffffffdbd0 = in_stack_ffffffffffffdbcc;
    in_stack_ffffffffffffdbd4 = in_stack_ffffffffffffdbcc;
    iVar3 = get_trust((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8));
    if (((in_stack_ffffffffffffdbcc <= iVar3) || (0x3c < *(short *)&ch_00->next_in_room)) &&
       (bVar1 = is_name(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0), bVar1)) {
      if (bVar2) {
        add_buf(in_stack_ffffffffffffdbe8,(char *)buffer);
      }
      if ((-1 < *(short *)&ch_00->next_in_room) && (bVar2 = str_cmp(local_1218,"imotd"), bVar2)) {
        add_buf(in_stack_ffffffffffffdbe8,(char *)buffer);
        add_buf(in_stack_ffffffffffffdbe8,(char *)buffer);
      }
      if (*(char *)&ch_00->leader->next == '.') {
        add_buf(in_stack_ffffffffffffdbe8,(char *)buffer);
      }
      else {
        add_buf(in_stack_ffffffffffffdbe8,(char *)buffer);
      }
      bVar2 = true;
      if (((*(long *)(in_RDI + 0x80) != 0) && (*(short *)(*(long *)(in_RDI + 0x80) + 0x32) != 0)) &&
         (*(short *)(*(long *)(in_RDI + 0x80) + 0x32) != 0xd)) break;
    }
  }
  if (bVar2) {
    buf_string(buffer);
    page_to_char((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8));
  }
  else {
    send_to_char((char *)buffer,ch_00);
  }
  free_buf((BUFFER *)0x54c862);
  return;
}

Assistant:

void do_oldhelp(CHAR_DATA *ch, char *argument)
{
	bool found= false;
	char argall[MAX_INPUT_LENGTH], argone[MAX_INPUT_LENGTH];

	if (argument[0] == '\0')
		argument = "summary";

	/* this parts handles help a b so that it returns help 'a b' */
	argall[0] = '\0';
	while (argument[0] != '\0')
	{
		argument = one_argument(argument, argone);

		if (argall[0] != '\0')
			strcat(argall, " ");

		strcat(argall, argone);
	}

	auto output = new_buf();
	for (auto pHelp = help_first; pHelp != nullptr; pHelp = pHelp->next)
	{
		auto level = (pHelp->level < 0) ? -1 * pHelp->level - 1 : pHelp->level;

		if (level > get_trust(ch))
		{
			if (pHelp->level < 61)
				continue;
		}

		if (is_name(argall, pHelp->keyword))
		{
			/* add separator if found */
			if (found)
				add_buf(output, "\n\r============================================================\n\r\n\r");

			if (pHelp->level >= 0 && str_cmp(argall, "imotd"))
			{
				add_buf(output, pHelp->keyword);
				add_buf(output, "\n\r");
			}

			/*
			 * Strip leading '.' to allow initial blanks.
			 */
			if (pHelp->text[0] == '.')
				add_buf(output, pHelp->text + 1);
			else
				add_buf(output, pHelp->text);

			found = true;

			/* small hack :) */
			if (ch->desc != nullptr && ch->desc->connected != CON_PLAYING && ch->desc->connected != CON_GEN_GROUPS)
				break;
		}
	}

	if (!found)
		send_to_char("No help on that word.\n\r", ch);
	else
		page_to_char(buf_string(output), ch);

	free_buf(output);
}